

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Field
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  key_type *__k;
  int iVar1;
  iterator iVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  GoogleOnceDynamic *this_00;
  string *element_name;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (field[0x50] == (FieldDescriptor)0x1) {
    __k = *(key_type **)(*(long *)(field + 0x58) + 8);
    if ((anonymous_namespace)::allowed_proto3_extendees_init_ != 2) {
      local_b0._M_dataplus._M_p = (pointer)&PTR__FunctionClosure0_0070aad0;
      local_b0._M_string_length = (size_type)anon_unknown_1::InitAllowedProto3Extendee;
      local_b0.field_2._M_allocated_capacity =
           local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      GoogleOnceInitImpl(&(anonymous_namespace)::allowed_proto3_extendees_init_,(Closure *)&local_b0
                        );
      internal::FunctionClosure0::~FunctionClosure0((FunctionClosure0 *)&local_b0);
    }
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((anonymous_namespace)::allowed_proto3_extendees__abi_cxx11_,__k);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &((anonymous_namespace)::allowed_proto3_extendees__abi_cxx11_->_M_impl).
         super__Rb_tree_header) {
      AddError(this,*(string **)(field + 8),&proto->super_Message,OTHER,
               "Extensions in proto3 are only allowed for defining options.");
    }
  }
  if (*(int *)(field + 0x4c) == 2) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,OTHER,
             "Required fields are not allowed in proto3.");
  }
  if (field[0x98] == (FieldDescriptor)0x1) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,OTHER,
             "Explicit default values are not allowed in proto3.");
  }
  if (*(GoogleOnceDynamic **)(field + 0x40) == (GoogleOnceDynamic *)0x0) {
    iVar1 = *(int *)(field + 0x48);
    if (iVar1 != 0xe) goto LAB_0057b80b;
LAB_0057b5dc:
    this_00 = (GoogleOnceDynamic *)0x0;
LAB_0057b5de:
    lVar3 = *(long *)(field + 0x78);
    if (lVar3 == 0) goto LAB_0057b7f4;
    if (this_00 != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (this_00,FieldDescriptor::TypeOnceInit,field);
      this_00 = *(GoogleOnceDynamic **)(field + 0x40);
      lVar3 = *(long *)(field + 0x78);
      if (*(int *)(*(long *)(lVar3 + 0x10) + 0x8c) != 3) {
        element_name = *(string **)(field + 8);
        if (this_00 != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                    (this_00,FieldDescriptor::TypeOnceInit,field);
          lVar3 = *(long *)(field + 0x78);
        }
        goto LAB_0057b64b;
      }
      goto LAB_0057b7f4;
    }
    if (*(int *)(*(long *)(lVar3 + 0x10) + 0x8c) != 3) {
      element_name = *(string **)(field + 8);
LAB_0057b64b:
      std::operator+(&local_50,"Enum type \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (lVar3 + 8));
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = &local_80;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_80 = *plVar5;
        lStack_78 = plVar4[3];
      }
      else {
        local_80 = *plVar5;
        local_90 = (long *)*plVar4;
      }
      local_88 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_90,**(ulong **)(*(long *)(field + 0x58) + 8));
      local_70 = &local_60;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_60 = *plVar5;
        lStack_58 = plVar4[3];
      }
      else {
        local_60 = *plVar5;
        local_70 = (long *)*plVar4;
      }
      local_68 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar6) {
        local_b0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_b0.field_2._8_8_ = plVar4[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_b0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_b0._M_string_length = plVar4[1];
      *plVar4 = (long)paVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      AddError(this,element_name,&proto->super_Message,TYPE,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      this_00 = *(GoogleOnceDynamic **)(field + 0x40);
      goto LAB_0057b7f4;
    }
  }
  else {
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(field + 0x40),FieldDescriptor::TypeOnceInit,field);
    this_00 = *(GoogleOnceDynamic **)(field + 0x40);
    if (*(int *)(field + 0x48) == 0xe) {
      if (this_00 == (GoogleOnceDynamic *)0x0) goto LAB_0057b5dc;
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (this_00,FieldDescriptor::TypeOnceInit,field);
      this_00 = *(GoogleOnceDynamic **)(field + 0x40);
      goto LAB_0057b5de;
    }
LAB_0057b7f4:
    if (this_00 != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (this_00,FieldDescriptor::TypeOnceInit,field);
    }
  }
  iVar1 = *(int *)(field + 0x48);
LAB_0057b80b:
  if (iVar1 == 10) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
             "Groups are not supported in proto3 syntax.");
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Field(
    FieldDescriptor* field, const FieldDescriptorProto& proto) {
  if (field->is_extension() &&
      !AllowedExtendeeInProto3(field->containing_type()->full_name())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OTHER,
             "Extensions in proto3 are only allowed for defining options.");
  }
  if (field->is_required()) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OTHER,
             "Required fields are not allowed in proto3.");
  }
  if (field->has_default_value()) {
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::OTHER,
        "Explicit default values are not allowed in proto3.");
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
      field->enum_type() &&
      field->enum_type()->file()->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    // Proto3 messages can only use Proto3 enum types; otherwise we can't
    // guarantee that the default value is zero.
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::TYPE,
             "Enum type \"" + field->enum_type()->full_name() +
             "\" is not a proto3 enum, but is used in \"" +
             field->containing_type()->full_name() +
             "\" which is a proto3 message type.");
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::TYPE,
             "Groups are not supported in proto3 syntax.");
  }
}